

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprFirst(Fts5Expr *p,Fts5Index *pIdx,i64 iFirst,int bDesc)

{
  Fts5ExprNode *pNode;
  int iVar1;
  int local_34;
  int rc;
  Fts5ExprNode *pRoot;
  int bDesc_local;
  i64 iFirst_local;
  Fts5Index *pIdx_local;
  Fts5Expr *p_local;
  
  pNode = p->pRoot;
  p->pIndex = pIdx;
  p->bDesc = bDesc;
  local_34 = fts5ExprNodeFirst(p,pNode);
  if (((local_34 == 0) && (pNode->bEof == 0)) &&
     (iVar1 = fts5RowidCmp(p,pNode->iRowid,iFirst), iVar1 < 0)) {
    local_34 = (*pNode->xNext)(p,pNode,1,iFirst);
  }
  while (pNode->bNomatch != 0) {
    local_34 = (*pNode->xNext)(p,pNode,0,0);
  }
  return local_34;
}

Assistant:

static int sqlite3Fts5ExprFirst(Fts5Expr *p, Fts5Index *pIdx, i64 iFirst, int bDesc){
  Fts5ExprNode *pRoot = p->pRoot;
  int rc;                         /* Return code */

  p->pIndex = pIdx;
  p->bDesc = bDesc;
  rc = fts5ExprNodeFirst(p, pRoot);

  /* If not at EOF but the current rowid occurs earlier than iFirst in
  ** the iteration order, move to document iFirst or later. */
  if( rc==SQLITE_OK 
   && 0==pRoot->bEof 
   && fts5RowidCmp(p, pRoot->iRowid, iFirst)<0 
  ){
    rc = fts5ExprNodeNext(p, pRoot, 1, iFirst);
  }

  /* If the iterator is not at a real match, skip forward until it is. */
  while( pRoot->bNomatch ){
    assert( pRoot->bEof==0 && rc==SQLITE_OK );
    rc = fts5ExprNodeNext(p, pRoot, 0, 0);
  }
  return rc;
}